

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O3

void __thiscall
Json::Reader::addComment(Reader *this,Location begin,Location end,CommentPlacement placement)

{
  Value *this_00;
  string local_30;
  
  if (this->collectComments_ == false) {
    __assert_fail("collectComments_",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmjsoncpp/src/lib_json/json_reader.cpp"
                  ,0x164,"void Json::Reader::addComment(Location, Location, CommentPlacement)");
  }
  if (placement == commentAfterOnSameLine) {
    this_00 = this->lastValue_;
    if (this_00 == (Value *)0x0) {
      __assert_fail("lastValue_ != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmjsoncpp/src/lib_json/json_reader.cpp"
                    ,0x166,"void Json::Reader::addComment(Location, Location, CommentPlacement)");
    }
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_30);
    Value::setComment(this_00,&local_30,commentAfterOnSameLine);
  }
  else {
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_30);
    std::__cxx11::string::_M_append((char *)&this->commentsBefore_,(ulong)local_30._M_dataplus._M_p)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void
Reader::addComment(Location begin, Location end, CommentPlacement placement) {
  assert(collectComments_);
  if (placement == commentAfterOnSameLine) {
    assert(lastValue_ != 0);
    lastValue_->setComment(std::string(begin, end), placement);
  } else {
    commentsBefore_ += std::string(begin, end);
  }
}